

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O2

void gravity_lexer_skip_line(gravity_lexer_t *lexer)

{
  _Bool _Var1;
  ulong in_RAX;
  int c;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  do {
    if (lexer->length <= lexer->offset) {
      return;
    }
    uStack_18 = uStack_18 & 0xffffffff;
    next_utf8(lexer,(int *)((long)&uStack_18 + 4));
    _Var1 = is_newline(lexer,uStack_18._4_4_);
  } while (!_Var1);
  lexer->lineno = lexer->lineno + 1;
  lexer->colno = 1;
  return;
}

Assistant:

void gravity_lexer_skip_line (gravity_lexer_t *lexer) {
    while (!IS_EOF) {
        int c = 0;
        next_utf8(lexer, &c);
        if (is_newline(lexer, c)) {
            INC_LINE;
            break;
        }
    }
}